

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O0

void cmpseq(seqdiff_results_t *results)

{
  int iVar1;
  gzFile pgVar2;
  kseq_t *pkVar3;
  sd_lookup_t *local_48;
  sd_lookup_t *local_40;
  sd_lookup_t *local_38;
  sd_lookup_t *temp;
  sd_lookup_t *s;
  kseq_t *seq;
  int l;
  gzFile fp;
  seqdiff_results_t *results_local;
  
  pgVar2 = (gzFile)gzopen(results->first_file,"r");
  if (pgVar2 == (gzFile)0x0) {
    fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,results->first_file);
    exit(1);
  }
  pkVar3 = kseq_init(pgVar2);
  while (iVar1 = kseq_read(pkVar3), -1 < iVar1) {
    results->first_file_total = results->first_file_total + 1;
    sd_add_seq(pkVar3,1,results->use_header);
  }
  kseq_destroy(pkVar3);
  gzclose(pgVar2);
  pgVar2 = (gzFile)gzopen(results->second_file,"r");
  if (pgVar2 != (gzFile)0x0) {
    pkVar3 = kseq_init(pgVar2);
    while (iVar1 = kseq_read(pkVar3), -1 < iVar1) {
      results->second_file_total = results->second_file_total + 1;
      sd_add_seq(pkVar3,2,results->use_header);
    }
    kseq_destroy(pkVar3);
    gzclose(pgVar2);
    temp = sd_lookup;
    if (sd_lookup == (sd_lookup_t *)0x0) {
      local_40 = (sd_lookup_t *)0x0;
    }
    else {
      local_40 = (sd_lookup_t *)(sd_lookup->hh).next;
    }
    local_38 = local_40;
    while (temp != (sd_lookup_t *)0x0) {
      if ((temp->in_a == 1) && (temp->in_b == 0)) {
        results->first_file_uniq = results->first_file_uniq + 1;
        if (results->only_summarize == 0) {
          fprintf(_stdout,"%s\t\n",temp->name);
        }
        if (results->a_output_fp != (FILE *)0x0) {
          print_fasta(results->a_output_fp,temp->name,temp->comment,temp->seq,0x32);
        }
      }
      else if ((temp->in_a == 0) && (temp->in_b == 1)) {
        results->second_file_uniq = results->second_file_uniq + 1;
        if (results->only_summarize == 0) {
          fprintf(_stdout,"\t%s\n",temp->name);
        }
        if (results->b_output_fp != (FILE *)0x0) {
          print_fasta(results->b_output_fp,temp->name,temp->comment,temp->seq,0x32);
        }
      }
      else if ((temp->in_a == 1) && (temp->in_b == 1)) {
        results->common = results->common + 1;
        if (results->only_summarize == 0) {
          fprintf(_stdout,"%s\t%s\n",temp->name,temp->name);
        }
        if (results->c_output_fp != (FILE *)0x0) {
          print_fasta(results->c_output_fp,temp->name,temp->comment,temp->seq,0x32);
        }
      }
      temp = local_38;
      if (local_38 == (sd_lookup_t *)0x0) {
        local_48 = (sd_lookup_t *)0x0;
      }
      else {
        local_48 = (sd_lookup_t *)(local_38->hh).next;
      }
      local_38 = local_48;
    }
    sd_delete_hash();
    return;
  }
  fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,results->second_file);
  exit(1);
}

Assistant:

void cmpseq(seqdiff_results_t *results) {
	gzFile fp;
	int l;
	kseq_t *seq;
	sd_lookup_t *s,*temp;

	/* open first sequence file */
	fp = gzopen(results->first_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,results->first_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */
	
	while((l = kseq_read(seq)) >= 0) {
		results->first_file_total++; /* increment first_file_total */
		sd_add_seq(seq,1,results->use_header);
	}

	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	/* process second_file */
	fp = gzopen(results->second_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,results->second_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */
	
	while((l = kseq_read(seq)) >= 0) {
		results->second_file_total++; /* increment second_file_total */
		sd_add_seq(seq,2,results->use_header);
	}

	kseq_destroy(seq); /* free kseq struct */
	gzclose(fp); /* done reading file */

	HASH_ITER(hh, sd_lookup, s, temp) {
		if (s->in_a == 1 && s->in_b == 0) {
			results->first_file_uniq++;
			if (!results->only_summarize)
				fprintf(stdout,"%s\t\n",s->name);
			/* printing out fasta or fastq????? */
			if (results->a_output_fp != NULL)
				print_fasta(results->a_output_fp, s->name, s->comment, s->seq, 50);
		} else if (s->in_a == 0 && s->in_b == 1) {
			results->second_file_uniq++;
			if (!results->only_summarize)
				fprintf(stdout,"\t%s\n",s->name);
			if (results->b_output_fp != NULL)
				print_fasta(results->b_output_fp, s->name, s->comment, s->seq, 50);
		} else if (s->in_a == 1 && s->in_b == 1) {
			results->common++;
			if (!results->only_summarize)
				fprintf(stdout,"%s\t%s\n",s->name,s->name);
			if (results->c_output_fp != NULL) {
				print_fasta(results->c_output_fp, s->name, s->comment, s->seq, 50);
			}
		}
	}

	sd_delete_hash(); /* free the hash nodes */
}